

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtspd.c
# Opt level: O0

int send_doc(curl_socket_t sock,httprequest *req)

{
  __pid_t _Var1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  FILE *__s;
  uint *puVar6;
  char *pcVar7;
  bool bVar8;
  bool bVar9;
  uint local_160;
  int local_15c;
  int num_2;
  int quarters;
  char command [32];
  char *local_130;
  size_t num_1;
  size_t num;
  char *filename;
  char msgbuf [64];
  size_t msglen;
  char partbuf [80];
  uint local_6c;
  int res;
  int error;
  size_t responsesize;
  _Bool sendfailure;
  _Bool persistant;
  FILE *dump;
  size_t cmdsize;
  char *cmd;
  FILE *stream;
  char *ptr;
  char *buffer;
  size_t count;
  ssize_t written;
  httprequest *req_local;
  curl_socket_t sock_local;
  
  stream = (FILE *)0x0;
  cmdsize = 0;
  dump = (FILE *)0x0;
  responsesize._7_1_ = 1;
  bVar9 = false;
  partbuf[0x38] = '\0';
  partbuf[0x39] = '\0';
  partbuf[0x3a] = '\0';
  partbuf[0x3b] = '\0';
  partbuf[0x3c] = '\0';
  partbuf[0x3d] = '\0';
  partbuf[0x3e] = '\0';
  partbuf[0x3f] = '\0';
  partbuf[0x40] = '\0';
  partbuf[0x41] = '\0';
  partbuf[0x42] = '\0';
  partbuf[0x43] = '\0';
  partbuf[0x44] = '\0';
  partbuf[0x45] = '\0';
  partbuf[0x46] = '\0';
  partbuf[0x47] = '\0';
  partbuf[0x28] = '\0';
  partbuf[0x29] = '\0';
  partbuf[0x2a] = '\0';
  partbuf[0x2b] = '\0';
  partbuf[0x2c] = '\0';
  partbuf[0x2d] = '\0';
  partbuf[0x2e] = '\0';
  partbuf[0x2f] = '\0';
  partbuf[0x30] = '\0';
  partbuf[0x31] = '\0';
  partbuf[0x32] = '\0';
  partbuf[0x33] = '\0';
  partbuf[0x34] = '\0';
  partbuf[0x35] = '\0';
  partbuf[0x36] = '\0';
  partbuf[0x37] = '\0';
  partbuf[0x18] = '\0';
  partbuf[0x19] = '\0';
  partbuf[0x1a] = '\0';
  partbuf[0x1b] = '\0';
  partbuf[0x1c] = '\0';
  partbuf[0x1d] = '\0';
  partbuf[0x1e] = '\0';
  partbuf[0x1f] = '\0';
  partbuf[0x20] = '\0';
  partbuf[0x21] = '\0';
  partbuf[0x22] = '\0';
  partbuf[0x23] = '\0';
  partbuf[0x24] = '\0';
  partbuf[0x25] = '\0';
  partbuf[0x26] = '\0';
  partbuf[0x27] = '\0';
  partbuf[8] = '\0';
  partbuf[9] = '\0';
  partbuf[10] = '\0';
  partbuf[0xb] = '\0';
  partbuf[0xc] = '\0';
  partbuf[0xd] = '\0';
  partbuf[0xe] = '\0';
  partbuf[0xf] = '\0';
  partbuf[0x10] = '\0';
  partbuf[0x11] = '\0';
  partbuf[0x12] = '\0';
  partbuf[0x13] = '\0';
  partbuf[0x14] = '\0';
  partbuf[0x15] = '\0';
  partbuf[0x16] = '\0';
  partbuf[0x17] = '\0';
  partbuf[0] = '\0';
  partbuf[1] = '\0';
  partbuf[2] = '\0';
  partbuf[3] = '\0';
  partbuf[4] = '\0';
  partbuf[5] = '\0';
  partbuf[6] = '\0';
  partbuf[7] = '\0';
  msglen = 0x61746164;
  written = (ssize_t)req;
  req_local._0_4_ = sock;
  logmsg("Send response number %ld part %ld",req->testno,req->partno);
  iVar3 = *(int *)(written + 0x24a2c);
  if (iVar3 != 0) {
    if (iVar3 == 1) {
      return 0;
    }
    if (iVar3 == 2) {
      buffer = (char *)0x1f;
      do {
        count = send((curl_socket_t)req_local,"a string to stream 01234567890\n",(size_t)buffer,
                     0x4000);
        if (got_exit_signal != 0) {
          return -1;
        }
      } while ((char *)count == buffer);
      logmsg("Stopped streaming");
      return -1;
    }
  }
  *(undefined1 *)(written + 0x24a10) = 0;
  if (*(long *)(written + 0x24a00) < 0) {
    switch(*(undefined8 *)(written + 0x24a00)) {
    case 0xfffffffffffffffa:
      logmsg("Replying to QUIT");
      ptr = docquit;
      break;
    case 0xfffffffffffffffb:
      logmsg("Replying to a bad CONNECT");
      ptr = docbadconnect;
      break;
    case 0xfffffffffffffffc:
      logmsg("Bailing out due to internal error");
      return -1;
    case 0xfffffffffffffffd:
      logmsg("Replying to CONNECT");
      ptr = docconnect;
      break;
    case 0xfffffffffffffffe:
      logmsg("Identifying ourselves as friends");
      _Var1 = getpid();
      curl_msnprintf((char *)&filename,0x40,"RTSP_SERVER WE ROOLZ: %ld\r\n",(long)_Var1);
      sVar4 = strlen((char *)&filename);
      curl_msnprintf(send_doc::weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",sVar4,
                     &filename);
      ptr = send_doc::weare;
      break;
    case 0xffffffffffffffff:
    default:
      logmsg("Replying to with a 404");
      if (*(int *)(written + 0x24a30) == 2) {
        ptr = doc404_HTTP;
      }
      else {
        ptr = doc404_RTSP;
      }
    }
    buffer = (char *)strlen(ptr);
  }
  else {
    pcVar5 = test2file(*(long *)(written + 0x24a00));
    if (*(long *)(written + 0x24a08) != 0) {
      curl_msnprintf((char *)&msglen,0x50,"data%ld",*(undefined8 *)(written + 0x24a08));
    }
    cmd = (char *)fopen64(pcVar5,"rb");
    if ((FILE *)cmd == (FILE *)0x0) {
      puVar6 = (uint *)__errno_location();
      uVar2 = *puVar6;
      pcVar7 = strerror(uVar2);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar7);
      logmsg("Error opening file: %s",pcVar5);
      logmsg("Couldn\'t open test file");
      return 0;
    }
    uVar2 = getpart((char **)&stream,(size_t *)&buffer,"reply",(char *)&msglen,(FILE *)cmd);
    fclose((FILE *)cmd);
    if (uVar2 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar2);
      return 0;
    }
    ptr = (char *)stream;
    if (got_exit_signal != 0) {
      free(stream);
      return -1;
    }
    cmd = (char *)fopen64(pcVar5,"rb");
    if ((FILE *)cmd == (FILE *)0x0) {
      puVar6 = (uint *)__errno_location();
      uVar2 = *puVar6;
      pcVar7 = strerror(uVar2);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar7);
      logmsg("Error opening file: %s",pcVar5);
      logmsg("Couldn\'t open test file");
      free(stream);
      return 0;
    }
    uVar2 = getpart((char **)&cmdsize,(size_t *)&dump,"reply","postcmd",(FILE *)cmd);
    fclose((FILE *)cmd);
    if (uVar2 != 0) {
      logmsg("getpart() failed with error: %d",(ulong)uVar2);
      free(stream);
      return 0;
    }
  }
  local_6c = 0;
  if (got_exit_signal == 0) {
    pcVar5 = strstr(ptr,"swsclose");
    if ((pcVar5 != (char *)0x0) || (buffer == (char *)0x0)) {
      responsesize._7_1_ = 0;
      logmsg("connection close instruction \"swsclose\" found in response");
    }
    pcVar5 = strstr(ptr,"swsbounce");
    if (pcVar5 == (char *)0x0) {
      prevbounce = false;
    }
    else {
      prevbounce = true;
      logmsg("enable \"swsbounce\" in the next request");
    }
    __s = fopen64("log/server.response","ab");
    pcVar5 = buffer;
    if (__s == (FILE *)0x0) {
      puVar6 = (uint *)__errno_location();
      uVar2 = *puVar6;
      pcVar5 = strerror(uVar2);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar2,pcVar5);
      logmsg("Error opening file: %s","log/server.response");
      logmsg("couldn\'t create logfile: log/server.response");
      free(stream);
      free((void *)cmdsize);
      req_local._4_4_ = -1;
    }
    else {
      do {
        num_1 = (size_t)buffer;
        if ((char *)0xc8 < buffer) {
          num_1 = 200;
        }
        count = send((curl_socket_t)req_local,ptr,num_1,0x4000);
        if ((long)count < 0) {
          bVar9 = true;
          break;
        }
        logmsg("Sent off %zd bytes",count);
        fwrite(ptr,1,count,__s);
        if (got_exit_signal != 0) break;
        buffer = buffer + -count;
        ptr = ptr + count;
      } while (buffer != (char *)0x0);
      if (*(long *)(written + 0x24a40) != 0) {
        logmsg("About to write %zu RTP bytes",*(undefined8 *)(written + 0x24a48));
        buffer = *(char **)(written + 0x24a48);
        do {
          local_130 = buffer;
          if ((char *)0xc8 < buffer) {
            local_130 = (char *)0xc8;
          }
          count = send((curl_socket_t)req_local,
                       (void *)(*(long *)(written + 0x24a40) +
                               (*(long *)(written + 0x24a48) - (long)buffer)),(size_t)local_130,
                       0x4000);
          if ((long)count < 0) {
            bVar9 = true;
            break;
          }
          buffer = buffer + -count;
        } while (buffer != (char *)0x0);
        free(*(void **)(written + 0x24a40));
        *(undefined8 *)(written + 0x24a48) = 0;
      }
      do {
        iVar3 = fclose(__s);
        bVar8 = false;
        if (iVar3 != 0) {
          puVar6 = (uint *)__errno_location();
          local_6c = *puVar6;
          bVar8 = local_6c == 4;
        }
      } while (bVar8);
      if (iVar3 != 0) {
        pcVar7 = strerror(local_6c);
        logmsg("Error closing file %s error: %d %s","log/server.response",(ulong)local_6c,pcVar7);
      }
      if (got_exit_signal == 0) {
        if (bVar9) {
          logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent",
                 (long)pcVar5 - (long)buffer,pcVar5);
          free(stream);
          free((void *)cmdsize);
          req_local._4_4_ = -1;
        }
        else {
          logmsg("Response sent (%zu bytes) and written to log/server.response",pcVar5);
          free(stream);
          if (dump != (FILE *)0x0) {
            stream = (FILE *)cmdsize;
            do {
              iVar3 = __isoc99_sscanf(stream,"%31s %d",&num_2,&local_160);
              if (iVar3 == 2) {
                iVar3 = strcmp("wait",(char *)&num_2);
                if (iVar3 == 0) {
                  logmsg("Told to sleep for %d seconds",(ulong)local_160);
                  local_15c = local_160 << 2;
                  do {
                    if (local_15c < 1) goto LAB_00108694;
                    local_15c = local_15c + -1;
                    iVar3 = wait_ms(0xfa);
                    if (got_exit_signal != 0) goto LAB_00108694;
                  } while (iVar3 == 0);
                  puVar6 = (uint *)__errno_location();
                  uVar2 = *puVar6;
                  pcVar5 = strerror(uVar2);
                  logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar2,pcVar5);
LAB_00108694:
                  if (local_15c == 0) {
                    logmsg("Continuing after sleeping %d seconds",(ulong)local_160);
                  }
                }
                else {
                  logmsg("Unknown command in reply command section");
                }
              }
              pcVar5 = strchr((char *)stream,10);
              if (pcVar5 == (char *)0x0) {
                stream = (FILE *)0x0;
              }
              else {
                stream = (FILE *)(pcVar5 + 1);
              }
              bVar9 = false;
              if (stream != (FILE *)0x0) {
                bVar9 = (char)stream->_flags != '\0';
              }
            } while (bVar9);
          }
          free((void *)cmdsize);
          *(undefined1 *)(written + 0x24a10) = responsesize._7_1_;
          prevtestno = *(long *)(written + 0x24a00);
          prevpartno = *(long *)(written + 0x24a08);
          req_local._4_4_ = 0;
        }
      }
      else {
        free(stream);
        free((void *)cmdsize);
        req_local._4_4_ = -1;
      }
    }
  }
  else {
    free(stream);
    free((void *)cmdsize);
    req_local._4_4_ = -1;
  }
  return req_local._4_4_;
}

Assistant:

static int send_doc(curl_socket_t sock, struct httprequest *req)
{
  ssize_t written;
  size_t count;
  const char *buffer;
  char *ptr=NULL;
  FILE *stream;
  char *cmd=NULL;
  size_t cmdsize=0;
  FILE *dump;
  bool persistant = TRUE;
  bool sendfailure = FALSE;
  size_t responsesize;
  int error = 0;
  int res;

  static char weare[256];

  char partbuf[80]="data";

  logmsg("Send response number %ld part %ld", req->testno, req->partno);

  switch(req->rcmd) {
  default:
  case RCMD_NORMALREQ:
    break; /* continue with business as usual */
  case RCMD_STREAM:
#define STREAMTHIS "a string to stream 01234567890\n"
    count = strlen(STREAMTHIS);
    for(;;) {
      written = swrite(sock, STREAMTHIS, count);
      if(got_exit_signal)
        return -1;
      if(written != (ssize_t)count) {
        logmsg("Stopped streaming");
        break;
      }
    }
    return -1;
  case RCMD_IDLE:
    /* Do nothing. Sit idle. Pretend it rains. */
    return 0;
  }

  req->open = FALSE;

  if(req->testno < 0) {
    size_t msglen;
    char msgbuf[64];

    switch(req->testno) {
    case DOCNUMBER_QUIT:
      logmsg("Replying to QUIT");
      buffer = docquit;
      break;
    case DOCNUMBER_WERULEZ:
      /* we got a "friends?" question, reply back that we sure are */
      logmsg("Identifying ourselves as friends");
      snprintf(msgbuf, sizeof(msgbuf), "RTSP_SERVER WE ROOLZ: %ld\r\n",
               (long)getpid());
      msglen = strlen(msgbuf);
      snprintf(weare, sizeof(weare),
               "HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
               msglen, msgbuf);
      buffer = weare;
      break;
    case DOCNUMBER_INTERNAL:
      logmsg("Bailing out due to internal error");
      return -1;
    case DOCNUMBER_CONNECT:
      logmsg("Replying to CONNECT");
      buffer = docconnect;
      break;
    case DOCNUMBER_BADCONNECT:
      logmsg("Replying to a bad CONNECT");
      buffer = docbadconnect;
      break;
    case DOCNUMBER_404:
    default:
      logmsg("Replying to with a 404");
      if(req->protocol == RPROT_HTTP) {
        buffer = doc404_HTTP;
      }
      else {
        buffer = doc404_RTSP;
      }
      break;
    }

    count = strlen(buffer);
  }
  else {
    char *filename = test2file(req->testno);

    if(0 != req->partno)
      snprintf(partbuf, sizeof(partbuf), "data%ld", req->partno);

    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("Error opening file: %s", filename);
      logmsg("Couldn't open test file");
      return 0;
    }
    else {
      error = getpart(&ptr, &count, "reply", partbuf, stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        return 0;
      }
      buffer = ptr;
    }

    if(got_exit_signal) {
      free(ptr);
      return -1;
    }

    /* re-open the same file again */
    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("Error opening file: %s", filename);
      logmsg("Couldn't open test file");
      free(ptr);
      return 0;
    }
    else {
      /* get the custom server control "commands" */
      error = getpart(&cmd, &cmdsize, "reply", "postcmd", stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        free(ptr);
        return 0;
      }
    }
  }

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  /* If the word 'swsclose' is present anywhere in the reply chunk, the
     connection will be closed after the data has been sent to the requesting
     client... */
  if(strstr(buffer, "swsclose") || !count) {
    persistant = FALSE;
    logmsg("connection close instruction \"swsclose\" found in response");
  }
  if(strstr(buffer, "swsbounce")) {
    prevbounce = TRUE;
    logmsg("enable \"swsbounce\" in the next request");
  }
  else
    prevbounce = FALSE;

  dump = fopen(RESPONSE_DUMP, "ab");
  if(!dump) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("Error opening file: %s", RESPONSE_DUMP);
    logmsg("couldn't create logfile: " RESPONSE_DUMP);
    free(ptr);
    free(cmd);
    return -1;
  }

  responsesize = count;
  do {
    /* Ok, we send no more than 200 bytes at a time, just to make sure that
       larger chunks are split up so that the client will need to do multiple
       recv() calls to get it and thus we exercise that code better */
    size_t num = count;
    if(num > 200)
      num = 200;
    written = swrite(sock, buffer, num);
    if(written < 0) {
      sendfailure = TRUE;
      break;
    }
    else {
      logmsg("Sent off %zd bytes", written);
    }
    /* write to file as well */
    fwrite(buffer, 1, (size_t)written, dump);
    if(got_exit_signal)
      break;

    count -= written;
    buffer += written;
  } while(count>0);

  /* Send out any RTP data */
  if(req->rtp_buffer) {
    logmsg("About to write %zu RTP bytes", req->rtp_buffersize);
    count = req->rtp_buffersize;
    do {
      size_t num = count;
      if(num > 200)
        num = 200;
      written = swrite(sock, req->rtp_buffer + (req->rtp_buffersize - count),
                       num);
      if(written < 0) {
        sendfailure = TRUE;
        break;
      }
      count -= written;
    } while(count > 0);

    free(req->rtp_buffer);
    req->rtp_buffersize = 0;
  }

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           RESPONSE_DUMP, error, strerror(error));

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  if(sendfailure) {
    logmsg("Sending response failed. Only (%zu bytes) of "
           "(%zu bytes) were sent",
           responsesize-count, responsesize);
    free(ptr);
    free(cmd);
    return -1;
  }

  logmsg("Response sent (%zu bytes) and written to " RESPONSE_DUMP,
         responsesize);
  free(ptr);

  if(cmdsize > 0) {
    char command[32];
    int quarters;
    int num;
    ptr=cmd;
    do {
      if(2 == sscanf(ptr, "%31s %d", command, &num)) {
        if(!strcmp("wait", command)) {
          logmsg("Told to sleep for %d seconds", num);
          quarters = num * 4;
          while(quarters > 0) {
            quarters--;
            res = wait_ms(250);
            if(got_exit_signal)
              break;
            if(res) {
              /* should not happen */
              error = errno;
              logmsg("wait_ms() failed with error: (%d) %s",
                     error, strerror(error));
              break;
            }
          }
          if(!quarters)
            logmsg("Continuing after sleeping %d seconds", num);
        }
        else
          logmsg("Unknown command in reply command section");
      }
      ptr = strchr(ptr, '\n');
      if(ptr)
        ptr++;
      else
        ptr = NULL;
    } while(ptr && *ptr);
  }
  free(cmd);
  req->open = persistant;

  prevtestno = req->testno;
  prevpartno = req->partno;

  return 0;
}